

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,monostate *value,allocator_type *alloc)

{
  Path *other;
  interval<unsigned_long> *key;
  Path *this_00;
  uint32_t *puVar1;
  uint uVar2;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pEVar6;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar7;
  bool bVar8;
  ulong uVar9;
  interval<unsigned_long> *currKey;
  ulong *puVar10;
  ulong uVar11;
  uint uVar12;
  unsigned_long *puVar13;
  unsigned_long uVar14;
  BranchNode<unsigned_long,_8U,_true> *self;
  ulong uVar15;
  void *pvVar16;
  long lVar17;
  iterator nextIt;
  iterator local_70;
  
  pIVar3 = (this->super_iterator).super_const_iterator.map;
  uVar9 = (ulong)pIVar3->rootSize;
  if (pIVar3->height == 0) {
    if (uVar9 == 0) {
      uVar11 = 0;
    }
    else {
      uVar4 = (this->searchKey).left;
      puVar13 = &(pIVar3->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                 .first[0].right;
      uVar15 = 0;
      do {
        uVar11 = uVar15;
        if ((uVar4 <= ((interval<unsigned_long> *)(puVar13 + -1))->left) || (uVar4 <= *puVar13 + 1))
        break;
        uVar15 = uVar15 + 1;
        puVar13 = puVar13 + 2;
        uVar11 = uVar9;
      } while (uVar9 != uVar15);
    }
    const_iterator::setRoot((const_iterator *)this,(uint32_t)uVar11);
  }
  else {
    if (uVar9 == 0) {
      uVar11 = 0;
    }
    else {
      uVar4 = (this->searchKey).left;
      puVar13 = (unsigned_long *)
                ((long)((pIVar3->field_0).rootLeaf.
                        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                        .first + 4) + 8);
      uVar15 = 0;
      do {
        uVar11 = uVar15;
        if ((uVar4 <= ((interval<unsigned_long> *)(puVar13 + -1))->left) || (uVar4 <= *puVar13 + 1))
        break;
        uVar15 = uVar15 + 1;
        puVar13 = puVar13 + 2;
        uVar11 = uVar9;
      } while (uVar9 != uVar15);
    }
    const_iterator::setRoot((const_iterator *)this,(uint32_t)uVar11);
    treeFindUnion(this);
  }
  sVar5 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if (sVar5 != 0) {
    other = &(this->super_iterator).super_const_iterator.path;
    pEVar6 = (other->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    if (pEVar6->offset < pEVar6->size) {
      pvVar16 = pEVar6[sVar5 - 1].node;
      lVar17 = (ulong)pEVar6[sVar5 - 1].offset * 0x10;
      key = &this->searchKey;
      uVar9 = *(ulong *)((long)pvVar16 + lVar17);
      uVar11 = *(ulong *)((long)pvVar16 + lVar17 + 8);
      uVar4 = (this->searchKey).left;
      uVar14 = (this->searchKey).right;
      if (uVar11 + 1 < uVar4 || uVar14 + 1 < uVar9) {
        iterator::insert(&this->super_iterator,uVar4,uVar14,value,alloc);
      }
      else {
        puVar10 = (ulong *)((long)pvVar16 + lVar17);
        if (uVar4 < uVar9) {
          uVar9 = uVar4;
        }
        *puVar10 = uVar9;
        if (uVar14 < uVar11) {
          uVar14 = uVar11;
        }
        puVar10[1] = uVar14;
        uVar9 = puVar10[1];
        key->left = *puVar10;
        (this->searchKey).right = uVar9;
        iterator::updateParentBounds(&this->super_iterator,(int)sVar5 - 1,key);
      }
      this_00 = &local_70.super_const_iterator.path;
      do {
        while( true ) {
          pIVar7 = (this->super_iterator).super_const_iterator.map;
          pEVar6 = (this->super_iterator).super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
          sVar5 = (this->super_iterator).super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
          uVar2 = pEVar6[sVar5 - 1].size;
          uVar12 = pEVar6[sVar5 - 1].offset + 1;
          if (pIVar7->height != 0) break;
          if (uVar2 <= uVar12) {
            return;
          }
          pvVar16 = pEVar6[sVar5 - 1].node;
          lVar17 = (ulong)uVar12 * 0x10;
          uVar9 = *(ulong *)((long)pvVar16 + lVar17);
          if ((this->searchKey).right + 1 < uVar9) {
            return;
          }
LAB_0043177f:
          uVar11 = *(ulong *)((long)pvVar16 + lVar17 + 8);
          lVar17 = (ulong)pEVar6[sVar5 - 1].offset * 0x10;
          uVar4 = *(ulong *)((long)pvVar16 + lVar17 + 8);
          uVar15 = *(ulong *)((long)pvVar16 + lVar17);
          if (uVar9 < *(ulong *)((long)pvVar16 + lVar17)) {
            uVar15 = uVar9;
          }
          *(ulong *)((long)pvVar16 + lVar17) = uVar15;
          if (uVar11 < uVar4) {
            uVar11 = uVar4;
          }
          *(ulong *)((long)pvVar16 + lVar17 + 8) = uVar11;
          uVar14 = ((unsigned_long *)((long)pvVar16 + lVar17))[1];
          key->left = *(unsigned_long *)((long)pvVar16 + lVar17);
          (this->searchKey).right = uVar14;
          pEVar6[sVar5 - 1].offset = uVar12;
          iterator::erase(&this->super_iterator,alloc,false);
          puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                    [(this->super_iterator).super_const_iterator.path.path.
                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
          *puVar1 = *puVar1 - 1;
        }
        if (uVar12 < uVar2) {
          pvVar16 = pEVar6[sVar5 - 1].node;
          lVar17 = (ulong)uVar12 * 0x10;
          uVar9 = *(ulong *)((long)pvVar16 + lVar17);
          if (uVar9 <= (this->searchKey).right + 1) goto LAB_0043177f;
        }
        if (uVar12 != uVar2) {
          return;
        }
        local_70.super_const_iterator.map = pIVar7;
        SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                  (&this_00->path,(Base *)other);
        IntervalMapDetails::Path::moveRight(this_00,pIVar3->height);
        if (((local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
            ((local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
             (local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
           (local_70.super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
            [local_70.super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) {
LAB_004317d8:
          if (local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
              (pointer)local_70.super_const_iterator.path.path.
                       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
            operator_delete(local_70.super_const_iterator.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
          }
          return;
        }
        uVar9 = *local_70.super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                 [local_70.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node;
        if ((this->searchKey).right + 1 < uVar9) goto LAB_004317d8;
        uVar11 = *(ulong *)((long)local_70.super_const_iterator.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_[local_70.super_const_iterator.path.path.
                                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                        .len - 1].node + 8);
        pEVar6 = (this->super_iterator).super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
        sVar5 = (this->super_iterator).super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
        pvVar16 = pEVar6[sVar5 - 1].node;
        lVar17 = (ulong)pEVar6[sVar5 - 1].offset * 0x10;
        uVar4 = *(ulong *)((long)pvVar16 + lVar17 + 8);
        uVar15 = *(ulong *)((long)pvVar16 + lVar17);
        if (uVar9 < *(ulong *)((long)pvVar16 + lVar17)) {
          uVar15 = uVar9;
        }
        *(ulong *)((long)pvVar16 + lVar17) = uVar15;
        if (uVar11 < uVar4) {
          uVar11 = uVar4;
        }
        *(ulong *)((long)pvVar16 + lVar17 + 8) = uVar11;
        uVar14 = ((unsigned_long *)((long)pvVar16 + lVar17))[1];
        key->left = *(unsigned_long *)((long)pvVar16 + lVar17);
        (this->searchKey).right = uVar14;
        iterator::updateParentBounds(&this->super_iterator,(int)sVar5 - 1,key);
        bVar8 = iterator::erase(&local_70,alloc,true);
        if (bVar8) {
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                     (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00);
          IntervalMapDetails::Path::moveLeft(other,pIVar3->height);
        }
        if (local_70.super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
            (pointer)local_70.super_const_iterator.path.path.
                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
          operator_delete(local_70.super_const_iterator.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
        }
      } while( true );
    }
  }
  iterator::insert(&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,alloc)
  ;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}